

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
               (IntegerDecimalCastData<short> *state)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint16_t uVar4;
  result_t tmp;
  short local_a;
  
  local_a = (short)state->result;
  if ((long)local_a == state->result) {
    uVar3 = state->decimal;
    if (10 < (long)uVar3) {
      uVar4 = state->decimal_digits;
      uVar2 = uVar3;
      do {
        uVar3 = uVar2 / 10;
        uVar4 = uVar4 - 1;
        bVar1 = 0x6d < uVar2;
        uVar2 = uVar3;
      } while (bVar1);
      state->decimal = uVar3;
      state->decimal_digits = uVar4;
    }
    bVar1 = true;
    if ((4 < (long)uVar3) && (state->decimal_digits == 1)) {
      bVar1 = TrySubtractOperator::Operation<short,short,short>(local_a,1,&local_a);
    }
    state->result = (long)local_a;
    return bVar1;
  }
  return false;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		using store_t = typename T::StoreType;

		result_t tmp;
		if (!TryCast::Operation<store_t, result_t>(state.result, tmp)) {
			return false;
		}

		while (state.decimal > 10) {
			state.decimal /= 10;
			state.decimal_digits--;
		}

		bool success = true;
		if (state.decimal_digits == 1 && state.decimal >= 5) {
			if (NEGATIVE) {
				success = TrySubtractOperator::Operation(tmp, (result_t)1, tmp);
			} else {
				success = TryAddOperator::Operation(tmp, (result_t)1, tmp);
			}
		}
		state.result = tmp;
		return success;
	}